

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.cpp
# Opt level: O0

void __thiscall MyEntity::MyEntity(MyEntity *this)

{
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffff70;
  int p;
  undefined8 *fun;
  MyEntity *obj;
  GEvent<MyEntity> *in_stack_ffffffffffffff90;
  undefined1 local_29 [41];
  
  obj = (MyEntity *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"",(allocator *)obj);
  MetaSim::Entity::Entity((Entity *)in_stack_ffffffffffffff90,(string *)obj);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  *in_RDI = &PTR__MyEntity_0022b3c8;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  fun = in_RDI + 7;
  MetaSim::GEvent<MyEntity>::GEvent
            (in_stack_ffffffffffffff90,obj,(Pmemfun)fun,
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  p = (int)((ulong)(in_RDI + 0x1b) >> 0x20);
  MetaSim::GEvent<MyEntity>::GEvent(in_stack_ffffffffffffff90,obj,(Pmemfun)fun,p);
  MetaSim::GEvent<MyEntity>::GEvent((GEvent<MyEntity> *)onEventC,obj,(Pmemfun)fun,p);
  return;
}

Assistant:

MyEntity::MyEntity() : Entity(""),
		       afirst(false),
		       bfirst(false),
		       count(0),
		       eventA(this, &MyEntity::onEventA),
		       eventB(this, &MyEntity::onEventB),
		       eventC(this, &MyEntity::onEventC)
{
}